

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

ssize_t __thiscall
anon_unknown.dwarf_1fe6b52::WriterSpy::write(WriterSpy *this,int __fd,void *__buf,size_t __n)

{
  element_type *peVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  string buf;
  undefined8 local_48;
  undefined8 local_40;
  
  uVar2 = (**(code **)((long)*(this->w).super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 0x20))();
  if ((char)uVar2 != '\0') {
    std::__cxx11::string::string((string *)&local_48,(string *)&this->prefix);
    std::__cxx11::string::append<char_const*,void>
              ((string *)&local_48,(char *)CONCAT44(in_register_00000034,__fd),
               (char *)((long)__buf + (long)CONCAT44(in_register_00000034,__fd)));
    peVar1 = (this->s).super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**(code **)((long)*peVar1 + 0x20))(peVar1,local_48,local_40);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return (ulong)uVar2;
}

Assistant:

bool write(const void* buffer, size_t n) override {
    if (!w->write(buffer, n)) {
      return false;
    }
    auto chars = reinterpret_cast<const char*>(buffer);
    std::string buf = prefix;
    buf.append(chars, chars + n);
    s->write(buf.data(), buf.size());
    return true;
  }